

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffdtyp(char *cval,char *dtype,int *status)

{
  char *pcVar1;
  int *in_RDX;
  undefined1 *in_RSI;
  char *in_RDI;
  undefined4 local_4;
  
  if (*in_RDX < 1) {
    if (*in_RDI == '\0') {
      *in_RDX = 0xcc;
      local_4 = 0xcc;
    }
    else {
      if (*in_RDI == '\'') {
        *in_RSI = 0x43;
      }
      else if ((*in_RDI == 'T') || (*in_RDI == 'F')) {
        *in_RSI = 0x4c;
      }
      else if (*in_RDI == '(') {
        *in_RSI = 0x58;
      }
      else {
        pcVar1 = strchr(in_RDI,0x2e);
        if (pcVar1 == (char *)0x0) {
          pcVar1 = strchr(in_RDI,0x45);
          if ((pcVar1 == (char *)0x0) && (pcVar1 = strchr(in_RDI,0x44), pcVar1 == (char *)0x0)) {
            *in_RSI = 0x49;
          }
          else {
            *in_RSI = 0x46;
          }
        }
        else {
          *in_RSI = 0x46;
        }
      }
      local_4 = *in_RDX;
    }
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffdtyp(const char *cval,  /* I - formatted string representation of the value */
           char *dtype, /* O - datatype code: C, L, F, I, or X */
          int *status)  /* IO - error status */
/*
  determine implicit datatype of input string.
  This assumes that the string conforms to the FITS standard
  for keyword values, so may not detect all invalid formats.
*/
{

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (cval[0] == '\0')
        return(*status = VALUE_UNDEFINED);
    else if (cval[0] == '\'')
        *dtype = 'C';          /* character string starts with a quote */
    else if (cval[0] == 'T' || cval[0] == 'F')
        *dtype = 'L';          /* logical = T or F character */
    else if (cval[0] == '(')
        *dtype = 'X';          /* complex datatype "(1.2, -3.4)" */
    else if (strchr(cval,'.'))
        *dtype = 'F';          /* float usualy contains a decimal point */
    else if (strchr(cval,'E') || strchr(cval,'D') )
        *dtype = 'F';          /* exponential contains a E or D */
    else
        *dtype = 'I';          /* if none of the above assume it is integer */

    return(*status);
}